

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ptexture.h
# Opt level: O1

void Ptex::v2_2::(anonymous_namespace)::Apply<Ptex::v2_2::PtexHalf,4>
               (PtexSeparableKernel *k,float *result,void *data,int param_4,int param_5)

{
  ushort *puVar1;
  float fVar2;
  byte bVar3;
  int iVar4;
  float *pfVar5;
  ushort *puVar6;
  long lVar7;
  float *pfVar8;
  int iVar9;
  long lVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  
  bVar3 = (k->res).ulog2;
  iVar9 = 4 << (bVar3 & 0x1f);
  lVar7 = (long)iVar9 * (long)k->vw;
  if ((int)lVar7 != 0) {
    puVar6 = (ushort *)((long)data + ((long)(k->v << (bVar3 & 0x1f)) + (long)k->u) * 8);
    puVar1 = puVar6 + lVar7;
    pfVar8 = k->kv;
    iVar4 = k->uw;
    pfVar5 = k->ku;
    do {
      fVar14 = *pfVar5;
      fVar11 = *(float *)(PtexHalf::h2fTable + (ulong)*puVar6 * 4) * fVar14;
      fVar12 = *(float *)(PtexHalf::h2fTable + (ulong)puVar6[1] * 4) * fVar14;
      fVar13 = *(float *)(PtexHalf::h2fTable + (ulong)puVar6[2] * 4) * fVar14;
      fVar14 = *(float *)(PtexHalf::h2fTable + (ulong)puVar6[3] * 4) * fVar14;
      if (iVar4 != 1) {
        lVar7 = 4;
        lVar10 = 0;
        do {
          fVar2 = *(float *)((long)pfVar5 + lVar7);
          fVar11 = fVar11 + fVar2 * *(float *)(PtexHalf::h2fTable + (ulong)puVar6[lVar7] * 4);
          fVar12 = fVar12 + fVar2 * *(float *)(PtexHalf::h2fTable + (ulong)puVar6[lVar7 + 1] * 4);
          fVar13 = fVar13 + fVar2 * *(float *)(PtexHalf::h2fTable + (ulong)puVar6[lVar7 + 2] * 4);
          fVar14 = fVar14 + fVar2 * *(float *)(PtexHalf::h2fTable + (ulong)puVar6[lVar7 + 3] * 4);
          lVar10 = lVar10 + -8;
          lVar7 = lVar7 + 4;
        } while ((long)(iVar4 * 4) * -2 + 8 != lVar10);
        puVar6 = (ushort *)((long)puVar6 - lVar10);
      }
      fVar2 = *pfVar8;
      pfVar8 = pfVar8 + 1;
      *result = fVar2 * fVar11 + *result;
      result[1] = fVar2 * fVar12 + result[1];
      result[2] = fVar2 * fVar13 + result[2];
      result[3] = fVar2 * fVar14 + result[3];
      puVar6 = puVar6 + (long)(iVar9 + iVar4 * -4) + 4;
    } while (puVar6 != puVar1);
  }
  return;
}

Assistant:

int u() const { return 1<<(unsigned)ulog2; }